

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

void __thiscall VECTOR_HORI_VERT::Vector::Vector(Vector *this,Vector *other)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  
  this->_vptr_Vector = (_func_int **)&PTR___cxa_pure_virtual_00108ce8;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  uVar1 = other->L;
  this->L = uVar1;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)(int)uVar1) {
    uVar4 = (long)(int)uVar1 * 4;
  }
  piVar3 = (int *)operator_new__(uVar4);
  this->vector_ = piVar3;
  if ((ulong)uVar1 != 0) {
    piVar2 = other->vector_;
    uVar4 = 0;
    do {
      piVar3[uVar4] = piVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  this->znak = other->znak;
  return;
}

Assistant:

Vector::Vector(const Vector& other) {
    filename_ = other.filename_;
    L = other.L;
    vector_ = new int[L];
    for (unsigned int i = 0; i < L; i++) {
      vector_[i] = other.vector_[i];
    }
    this->znak = other.znak;
  }